

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O2

void __thiscall
ElementsTransactionApi_FundRawTransaction_MinBits36_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_MinBits36_Test *this)

{
  pointer pTVar1;
  uint32_t uVar2;
  pointer hex;
  pointer pCVar3;
  ulong uVar4;
  char *pcVar5;
  Txid local_18d8;
  allocator local_18b3;
  allocator local_18b2;
  ElementsTransactionApi api;
  AssertionResult gtest_ar;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  ConfidentialTransactionContext context;
  string local_1768;
  UtxoFilter filter;
  ElementsAddressFactory factory;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  local_16d8;
  Amount estimate_fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  ExtPubkey key;
  ElementsConfidentialAddress reserve_ct_addr1;
  ConfidentialAssetId fee_asset;
  Privkey local_1378;
  string descMulti;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1338;
  SigHashType local_131c;
  ElementsConfidentialAddress ct_addr1;
  ElementsConfidentialAddress reserve_ct_addr2;
  ElementsConfidentialAddress ct_addr2;
  string local_de8;
  ConfidentialTransactionController ctx;
  ConfidentialTransactionContext tx;
  ElementsConfidentialAddress ct_addr3;
  ElementsConfidentialAddress ct_addr4;
  Address addr2;
  Address addr1;
  Address set_addr4;
  Address set_addr3;
  Address set_addr2;
  Address set_addr1;
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,2,0);
  utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory,kElementsRegtest);
  std::__cxx11::string::string
            ((string *)&descMulti,
             "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))"
             ,(allocator *)&ct_addr1);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (&utxos,((long)kFundCoinSelectElementsTestVector2.
                           super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)kFundCoinSelectElementsTestVector2.
                          super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x70);
  pTVar1 = kFundCoinSelectElementsTestVector2.
           super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  for (hex = kFundCoinSelectElementsTestVector2.
             super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
             ._M_impl.super__Vector_impl_data._M_start; hex != pTVar1; hex = hex + 1) {
    cfd::core::Txid::Txid((Txid *)&ct_addr2);
    if ((hex->txid)._M_string_length != 0) {
      cfd::core::Txid::Txid((Txid *)&ct_addr1,&hex->txid);
      cfd::core::Txid::operator=((Txid *)&ct_addr2,(Txid *)&ct_addr1);
      cfd::core::Txid::~Txid((Txid *)&ct_addr1);
    }
    cfd::core::Txid::Txid((Txid *)&ct_addr1,&hex->txid);
    cfd::core::Txid::operator=
              (&utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4].txid,(Txid *)&ct_addr1);
    cfd::core::Txid::~Txid((Txid *)&ct_addr1);
    utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4].vout = hex->vout;
    cfd::core::Amount::Amount((Amount *)&ct_addr1,hex->amount);
    utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4].amount.ignore_check_ =
         (bool)(undefined1)ct_addr1.unblinded_address_.witness_ver_;
    utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4].amount.amount_ = ct_addr1.unblinded_address_._0_8_;
    cfd::core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)&ct_addr1,&hex->asset);
    cfd::core::ConfidentialAssetId::operator=
              (&utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4].asset,(ConfidentialAssetId *)&ct_addr1);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&ct_addr1);
    std::__cxx11::string::_M_assign
              ((string *)
               &utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4].descriptor);
    utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4].address_type = kP2shP2wpkhAddress;
    uVar4 = (ulong)((int)uVar4 + 1);
    cfd::core::Txid::~Txid((Txid *)&ct_addr2);
  }
  std::__cxx11::string::string
            ((string *)&ct_addr1,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,(allocator *)&ct_addr2);
  cfd::core::ExtPubkey::ExtPubkey(&key,(string *)&ct_addr1);
  std::__cxx11::string::~string((string *)&ct_addr1);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&ct_addr1,&key,0xb);
  cfd::core::Extkey::GetPubkey((Pubkey *)&ct_addr2,(Extkey *)&ct_addr1);
  cfd::AddressFactory::CreateP2wpkhAddress
            (&set_addr1,&factory.super_AddressFactory,(Pubkey *)&ct_addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ct_addr2);
  cfd::core::Extkey::~Extkey((Extkey *)&ct_addr1);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&ct_addr1,&key,0xc);
  cfd::core::Extkey::GetPubkey((Pubkey *)&ct_addr2,(Extkey *)&ct_addr1);
  cfd::AddressFactory::CreateP2wpkhAddress
            (&set_addr2,&factory.super_AddressFactory,(Pubkey *)&ct_addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ct_addr2);
  cfd::core::Extkey::~Extkey((Extkey *)&ct_addr1);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&ct_addr1,&key,0xd);
  cfd::core::Extkey::GetPubkey((Pubkey *)&ct_addr2,(Extkey *)&ct_addr1);
  cfd::AddressFactory::CreateP2wpkhAddress
            (&set_addr3,&factory.super_AddressFactory,(Pubkey *)&ct_addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ct_addr2);
  cfd::core::Extkey::~Extkey((Extkey *)&ct_addr1);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&ct_addr1,&key,0xe);
  cfd::core::Extkey::GetPubkey((Pubkey *)&ct_addr2,(Extkey *)&ct_addr1);
  cfd::AddressFactory::CreateP2wpkhAddress
            (&set_addr4,&factory.super_AddressFactory,(Pubkey *)&ct_addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ct_addr2);
  cfd::core::Extkey::~Extkey((Extkey *)&ct_addr1);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&ct_addr2,&key,0x6f);
  cfd::core::Extkey::GetPubkey((Pubkey *)&ct_addr3,(Extkey *)&ct_addr2);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&ct_addr1,&set_addr1,(ConfidentialKey *)&ct_addr3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ct_addr3);
  cfd::core::Extkey::~Extkey((Extkey *)&ct_addr2);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&ct_addr3,&key,0x70);
  cfd::core::Extkey::GetPubkey((Pubkey *)&ct_addr4,(Extkey *)&ct_addr3);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&ct_addr2,&set_addr2,(ConfidentialKey *)&ct_addr4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ct_addr4);
  cfd::core::Extkey::~Extkey((Extkey *)&ct_addr3);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&ct_addr4,&key,0x71);
  cfd::core::Extkey::GetPubkey((Pubkey *)&reserve_ct_addr1,(Extkey *)&ct_addr4);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&ct_addr3,&set_addr3,(ConfidentialKey *)&reserve_ct_addr1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reserve_ct_addr1);
  cfd::core::Extkey::~Extkey((Extkey *)&ct_addr4);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&reserve_ct_addr1,&key,0x72);
  cfd::core::Extkey::GetPubkey((Pubkey *)&reserve_ct_addr2,(Extkey *)&reserve_ct_addr1);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&ct_addr4,&set_addr4,(ConfidentialKey *)&reserve_ct_addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reserve_ct_addr2);
  cfd::core::Extkey::~Extkey((Extkey *)&reserve_ct_addr1);
  cfd::core::Amount::Amount((Amount *)&reserve_ct_addr1,300000000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&tx,&ct_addr1,(Amount *)&reserve_ct_addr1,&exp_dummy_asset_a,false);
  cfd::core::Amount::Amount((Amount *)&reserve_ct_addr1,50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&tx,&ct_addr2,(Amount *)&reserve_ct_addr1,&exp_dummy_asset_b,false);
  cfd::core::Amount::Amount((Amount *)&reserve_ct_addr1,50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&tx,&ct_addr3,(Amount *)&reserve_ct_addr1,&exp_dummy_asset_a,false);
  cfd::core::Amount::Amount((Amount *)&reserve_ct_addr1,50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&tx,&ct_addr4,(Amount *)&reserve_ct_addr1,&exp_dummy_asset_a,false);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&fee_asset,&exp_dummy_asset_a);
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_target_value._M_t._M_impl.super__Rb_tree_header._M_header;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&reserve_ct_addr1,&exp_dummy_asset_a);
  cfd::core::Amount::Amount((Amount *)&reserve_ct_addr2,0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&map_target_value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reserve_ct_addr1,
             (Amount *)&reserve_ct_addr2);
  std::__cxx11::string::~string((string *)&reserve_ct_addr1);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&reserve_ct_addr1,&exp_dummy_asset_b);
  cfd::core::Amount::Amount((Amount *)&reserve_ct_addr2,0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&map_target_value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reserve_ct_addr1,
             (Amount *)&reserve_ct_addr2);
  std::__cxx11::string::~string((string *)&reserve_ct_addr1);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&reserve_ct_addr1,&key,1);
  cfd::core::Extkey::GetPubkey((Pubkey *)&reserve_ct_addr2,(Extkey *)&reserve_ct_addr1);
  cfd::AddressFactory::CreateP2wpkhAddress
            (&addr1,&factory.super_AddressFactory,(Pubkey *)&reserve_ct_addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reserve_ct_addr2);
  cfd::core::Extkey::~Extkey((Extkey *)&reserve_ct_addr1);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&reserve_ct_addr1,&key,2);
  cfd::core::Extkey::GetPubkey((Pubkey *)&reserve_ct_addr2,(Extkey *)&reserve_ct_addr1);
  cfd::AddressFactory::CreateP2wpkhAddress
            (&addr2,&factory.super_AddressFactory,(Pubkey *)&reserve_ct_addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reserve_ct_addr2);
  cfd::core::Extkey::~Extkey((Extkey *)&reserve_ct_addr1);
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&reserve_ct_addr1,&exp_dummy_asset_a);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&reserve_ct_addr2,&addr1);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&reserve_txout_address,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reserve_ct_addr1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reserve_ct_addr2)
  ;
  std::__cxx11::string::~string((string *)&reserve_ct_addr2);
  std::__cxx11::string::~string((string *)&reserve_ct_addr1);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&reserve_ct_addr1,&exp_dummy_asset_b);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&reserve_ct_addr2,&addr2);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&reserve_txout_address,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reserve_ct_addr1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reserve_ct_addr2)
  ;
  std::__cxx11::string::~string((string *)&reserve_ct_addr2);
  std::__cxx11::string::~string((string *)&reserve_ct_addr1);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&reserve_ct_addr2,&key,0x5b);
  cfd::core::Extkey::GetPubkey((Pubkey *)&context,(Extkey *)&reserve_ct_addr2);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&reserve_ct_addr1,&addr1,(ConfidentialKey *)&context);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&context);
  cfd::core::Extkey::~Extkey((Extkey *)&reserve_ct_addr2);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&context,&key,0x5c);
  cfd::core::Extkey::GetPubkey((Pubkey *)&option,(Extkey *)&context);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&reserve_ct_addr2,&addr2,(ConfidentialKey *)&option);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&option);
  cfd::core::Extkey::~Extkey((Extkey *)&context);
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&estimate_fee);
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&option);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&option);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option,0.1);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(&option,0.1);
  cfd::CoinSelectionOption::SetFeeAsset(&option,&fee_asset);
  cfd::CoinSelectionOption::SetBlindInfo(&option,0,0x24);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&context,(AbstractTransaction *)&tx);
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (&ctx,&api,(string *)&context,&utxos,&map_target_value,&selected_txin_utxos,
             &reserve_txout_address,&fee_asset,true,0.1,&estimate_fee,&filter,&option,
             &append_txout_addresses,kCfdInvalidSettingError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  std::__cxx11::string::~string((string *)&context);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)&context,&ctx.super_AbstractTransactionController);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"kExpTxData","ctx.GetHex().c_str()",
             "0200000000040a503dbd4f8f2b064c70e048b21f93fe4584174478abf5f44747932cd21da87c0000000000ffffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000ffffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000ffffffff020b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff070100000000000000000000000000000000000000000000000000000000000000aa01000110d9316ec00003b86ca86f23bc47e6ae1eebf2dea191f0ab98b89e2d5b6e5e8de20631441caeaa1600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb010000000ba43b740003a9dda6bdef90309c4fb5fe9131e396e9f9b32dc1b8defea451f71e6af1127b1d1600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b740003fef01583b95b37ee4f23d3673dfcc01faa4654272c289e8e3caa6aeb31f634741600144852255c0ff013e835689f30fb52508f89b6fbe20100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b7400037703a4ef463f044f462f35c4dece9d1f02d32681079c2c01cea4d6267dd782ef1600143159e9a1f6cdd588b6d5df65c3c7a190ecf0fba70100000000000000000000000000000000000000000000000000000000000000aa01000000000000026400000100000000000000000000000000000000000000000000000000000000000000bb01000000a2fb40580000160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa01000000fd340d189c0016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000"
             ,(char *)CONCAT71(context.super_ConfidentialTransaction.super_AbstractTransaction.
                               _vptr_AbstractTransaction._1_7_,
                               (char)context.super_ConfidentialTransaction.super_AbstractTransaction
                                     ._vptr_AbstractTransaction));
  std::__cxx11::string::~string((string *)&context);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&context);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_18d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x326,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_18d8,(Message *)&context);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&context);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_18d8._vptr_Txid = (_func_int **)CONCAT44(local_18d8._vptr_Txid._4_4_,0x264);
  gtest_ar._0_8_ = cfd::core::Amount::GetSatoshiValue(&estimate_fee);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&context,"612","estimate_fee.GetSatoshiValue()",(int *)&local_18d8,
             (long *)&gtest_ar);
  if ((char)context.super_ConfidentialTransaction.super_AbstractTransaction.
            _vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (context.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_ ==
        (void *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *context.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_18d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x327,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_18d8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&context.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_)
  ;
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  local_18d8._vptr_Txid =
       (_func_int **)
       ((long)append_txout_addresses.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)append_txout_addresses.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&context,"size_t{2}","append_txout_addresses.size()",
             (unsigned_long *)&gtest_ar,(unsigned_long *)&local_18d8);
  if ((char)context.super_ConfidentialTransaction.super_AbstractTransaction.
            _vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (context.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_ ==
        (void *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *context.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_18d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x328,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_18d8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&context.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_)
  ;
  if ((long)append_txout_addresses.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)append_txout_addresses.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x40) {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&context,&addr1);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"addr1.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",
               (char *)CONCAT71(context.super_ConfidentialTransaction.super_AbstractTransaction.
                                _vptr_AbstractTransaction._1_7_,
                                (char)context.super_ConfidentialTransaction.
                                      super_AbstractTransaction._vptr_AbstractTransaction),
               append_txout_addresses.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&context);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&context);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_18d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x32b,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_18d8,(Message *)&context);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18d8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&context);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&context,&addr2);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",
               (char *)CONCAT71(context.super_ConfidentialTransaction.super_AbstractTransaction.
                                _vptr_AbstractTransaction._1_7_,
                                (char)context.super_ConfidentialTransaction.
                                      super_AbstractTransaction._vptr_AbstractTransaction),
               ((append_txout_addresses.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&context);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&context);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_18d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x32c,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_18d8,(Message *)&context);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18d8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&context);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)&gtest_ar,&ctx.super_AbstractTransactionController);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&context,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&ct_addrs,&reserve_ct_addr1);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&ct_addrs,&reserve_ct_addr2);
  cfd::ConfidentialTransactionContext::CollectInputUtxo(&context,&utxos);
  cfd::ConfidentialTransactionContext::Blind
            (&context,&ct_addrs,1,0,0x24,
             (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
  cfd::core::ConfidentialTransaction::GetTxInList
            (&local_16d8,&context.super_ConfidentialTransaction);
  for (pCVar3 = local_16d8.
                super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar3 != local_16d8.
                super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar3 = pCVar3 + 1) {
    cfd::core::Txid::Txid(&local_18d8,&(pCVar3->super_AbstractTxInReference).txid_);
    cfd::core::OutPoint::OutPoint
              ((OutPoint *)&gtest_ar,&local_18d8,(pCVar3->super_AbstractTxInReference).vout_);
    std::__cxx11::string::string
              ((string *)&local_1768,
               "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_18b2);
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_1338,&local_1768);
    std::__cxx11::string::string
              ((string *)&local_de8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
               &local_18b3);
    cfd::core::Privkey::FromWif(&local_1378,&local_de8,kTestnet,true);
    cfd::core::SigHashType::SigHashType(&local_131c);
    cfd::ConfidentialTransactionContext::SignWithKey
              (&context,(OutPoint *)&gtest_ar,(Pubkey *)&local_1338,&local_1378,&local_131c,true,
               (ByteData256 *)0x0,(ByteData *)0x0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1378);
    std::__cxx11::string::~string((string *)&local_de8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1338);
    std::__cxx11::string::~string((string *)&local_1768);
    cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    cfd::core::Txid::~Txid(&local_18d8);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector(&local_16d8);
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&context.super_ConfidentialTransaction);
  if (uVar2 != 0x17e6) {
    uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&context.super_ConfidentialTransaction);
    if (uVar2 != 0x17e7) {
      uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&context.super_ConfidentialTransaction);
      if (uVar2 != 0x17e8) {
        local_18d8._vptr_Txid = (_func_int **)CONCAT44(local_18d8._vptr_Txid._4_4_,100);
        local_1768._M_dataplus._M_p._0_4_ =
             cfd::core::ConfidentialTransaction::GetVsize(&context.super_ConfidentialTransaction);
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&gtest_ar,"100","context.GetVsize()",(int *)&local_18d8,
                   (uint *)&local_1768);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_18d8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1768,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                     ,0x33c,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1768,(Message *)&local_18d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1768);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_18d8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
    }
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&ct_addrs);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&context);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctx);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&option.fee_asset_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&append_txout_addresses);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&selected_txin_utxos);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&reserve_ct_addr2);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&reserve_ct_addr1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&reserve_txout_address._M_t);
  cfd::core::Address::~Address(&addr2);
  cfd::core::Address::~Address(&addr1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&map_target_value._M_t);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&fee_asset);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&ct_addr4);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&ct_addr3);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&ct_addr2);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&ct_addr1);
  cfd::core::Address::~Address(&set_addr4);
  cfd::core::Address::~Address(&set_addr3);
  cfd::core::Address::~Address(&set_addr2);
  cfd::core::Address::~Address(&set_addr1);
  cfd::core::Extkey::~Extkey(&key.super_Extkey);
  std::__cxx11::string::~string((string *)&descMulti);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_MinBits36) {
  static const char* const kExpTxData = "0200000000040a503dbd4f8f2b064c70e048b21f93fe4584174478abf5f44747932cd21da87c0000000000ffffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000ffffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000ffffffff020b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff070100000000000000000000000000000000000000000000000000000000000000aa01000110d9316ec00003b86ca86f23bc47e6ae1eebf2dea191f0ab98b89e2d5b6e5e8de20631441caeaa1600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb010000000ba43b740003a9dda6bdef90309c4fb5fe9131e396e9f9b32dc1b8defea451f71e6af1127b1d1600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b740003fef01583b95b37ee4f23d3673dfcc01faa4654272c289e8e3caa6aeb31f634741600144852255c0ff013e835689f30fb52508f89b6fbe20100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b7400037703a4ef463f044f462f35c4dece9d1f02d32681079c2c01cea4d6267dd782ef1600143159e9a1f6cdd588b6d5df65c3c7a190ecf0fba70100000000000000000000000000000000000000000000000000000000000000aa01000000000000026400000100000000000000000000000000000000000000000000000000000000000000bb01000000a2fb40580000160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa01000000fd340d189c0016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000";

  ConfidentialTransactionContext tx(uint32_t{2}, uint32_t{0});
  std::vector<UtxoData> utxos;
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  std::string descMulti = "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))";

  try {
    utxos.resize(kFundCoinSelectElementsTestVector2.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector2) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      utxos[i].address_type = AddressType::kP2shP2wpkhAddress;
      ++i;
    }

    // add txout
    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    Address set_addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(11).GetPubkey());
    Address set_addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(12).GetPubkey());
    Address set_addr3 = factory.CreateP2wpkhAddress(key.DerivePubkey(13).GetPubkey());
    Address set_addr4 = factory.CreateP2wpkhAddress(key.DerivePubkey(14).GetPubkey());
    ElementsConfidentialAddress ct_addr1 = ElementsConfidentialAddress(
        set_addr1, key.DerivePubkey(111).GetPubkey());
    ElementsConfidentialAddress ct_addr2 = ElementsConfidentialAddress(
        set_addr2, key.DerivePubkey(112).GetPubkey());
    ElementsConfidentialAddress ct_addr3 = ElementsConfidentialAddress(
        set_addr3, key.DerivePubkey(113).GetPubkey());
    ElementsConfidentialAddress ct_addr4 = ElementsConfidentialAddress(
        set_addr4, key.DerivePubkey(114).GetPubkey());
    tx.AddTxOut(ct_addr1, Amount(int64_t{300000000000000}), exp_dummy_asset_a);
    tx.AddTxOut(ct_addr2, Amount(int64_t{50000000000}), exp_dummy_asset_b);
    tx.AddTxOut(ct_addr3, Amount(int64_t{50000000000}), exp_dummy_asset_a);
    tx.AddTxOut(ct_addr4, Amount(int64_t{50000000000}), exp_dummy_asset_a);

    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{0}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{0}));
    Address addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(1).GetPubkey());
    Address addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(2).GetPubkey());
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
        addr1, key.DerivePubkey(91).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
        addr2, key.DerivePubkey(92).GetPubkey());
    std::vector<ElementsUtxoAndOption> selected_txin_utxos;
    double fee_rate = 0.1;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(fee_rate);
    option.SetFeeAsset(fee_asset);
    option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);

    EXPECT_STREQ(kExpTxData, ctx.GetHex().c_str());
    EXPECT_EQ(612, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{2}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{2})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[1].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
    }

    ConfidentialTransactionContext context(ctx.GetHex());
    std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
    ct_addrs.push_back(reserve_ct_addr1);
    ct_addrs.push_back(reserve_ct_addr2);
    context.CollectInputUtxo(utxos);
    context.Blind(&ct_addrs, 1, 0, 36);
    for (const auto& txin : context.GetTxInList()) {
      context.SignWithKey(OutPoint(txin.GetTxid(), txin.GetVout()),
          Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
          Privkey::FromWif(
              "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet));
    }
    if ((context.GetVsize() != 6118) && (context.GetVsize() != 6119) && (context.GetVsize() != 6120)) {
      EXPECT_EQ(100, context.GetVsize());
    }
    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}